

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void todense<float,long>(size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                        long *Xc_indptr,double *buffer_arr)

{
  ulong *puVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  long *plVar7;
  long lVar8;
  
  for (lVar8 = 0; end * 8 + st * -8 + 8 != lVar8; lVar8 = lVar8 + 8) {
    *(undefined8 *)((long)buffer_arr + lVar8) = 0;
  }
  lVar8 = Xc_indptr[col_num];
  lVar3 = Xc_indptr[col_num + 1];
  uVar4 = (Xc_ind + lVar3)[-1];
  puVar2 = ix_arr + end + 1;
  puVar6 = std::__lower_bound<unsigned_long_const*,long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar2,Xc_ind + lVar8);
  do {
    puVar1 = (ulong *)(Xc_ind + lVar8);
    while( true ) {
      if (((puVar6 == puVar2) || (lVar8 == lVar3)) || (uVar5 = *puVar6, uVar4 < uVar5)) {
        return;
      }
      if (*puVar1 == uVar5) break;
      if ((long)*puVar1 <= (long)uVar5) goto LAB_0028c294;
      puVar6 = std::__lower_bound<unsigned_long_const*,long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar6 + 1,puVar2,puVar1);
    }
    *(double *)((long)buffer_arr + ((long)puVar6 - (long)(ix_arr + st))) = (double)Xc[lVar8];
    if (puVar6 == ix_arr + end) {
      return;
    }
    if (lVar8 == lVar3 + -1) {
      return;
    }
    puVar6 = puVar6 + 1;
LAB_0028c294:
    plVar7 = std::__lower_bound<long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar1 + 1,Xc_ind + lVar3,puVar6);
    lVar8 = (long)plVar7 - (long)Xc_ind >> 3;
  } while( true );
}

Assistant:

void todense(const size_t *restrict ix_arr, size_t st, size_t end,
             size_t col_num,
             const real_t *restrict Xc,
             const sparse_ix *restrict Xc_ind,
             const sparse_ix *restrict Xc_indptr,
             double *restrict buffer_arr)
{
    std::fill(buffer_arr, buffer_arr + (end - st + 1), (double)0);

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    const size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    for (const size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            buffer_arr[row - (ix_arr + st)] = Xc[curr_pos];
            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }
}